

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

bool __thiscall HEkk::debugNlaScalingOk(HEkk *this,HighsLp *lp)

{
  HighsScale *pHVar1;
  
  pHVar1 = (HighsScale *)0x0;
  if ((lp->scale_).has_scaling != false) {
    pHVar1 = &lp->scale_;
  }
  return (this->simplex_nla_).scale_ == pHVar1;
}

Assistant:

bool HEkk::debugNlaScalingOk(const HighsLp& lp) const {
  bool ok = true;
  assert(this->status_.has_nla);
  const HSimplexNla& simplex_nla = this->simplex_nla_;
  if (lp.scale_.has_scaling) {
    // The LP has scaling, so ensure that the simplex NLA has its scaling
    void* nla_scale = (void*)simplex_nla.scale_;
    void* lp_scale = (void*)(&lp.scale_);
    ok = nla_scale == lp_scale;
  } else {
    // The LP has no scaling, so ensure that the simplex NLA has no scaling
    ok = !simplex_nla.scale_;
  }
  assert(ok);
  return ok;
}